

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Tensor<3> *
Omega_h::inertia::anon_unknown_0::get_matrix
          (Tensor<3> *__return_storage_ptr__,CommPtr *comm,Reals *coords,Reals *masses,
          Vector<3> center)

{
  int size_in;
  undefined1 local_388 [48];
  Write<double> local_358;
  Read<double> local_348;
  shared_ptr<Omega_h::Comm> local_338;
  Real local_328;
  Vector<6> v;
  type f;
  allocator local_299;
  string local_298 [32];
  undefined1 local_278 [8];
  Write<double> weighted_contrib;
  LO n;
  Reals *masses_local;
  Reals *coords_local;
  CommPtr *comm_local;
  double local_230;
  double local_228;
  double dStack_220;
  double dStack_218;
  double dStack_210;
  double dStack_208;
  undefined4 local_1fc;
  Tensor<3> *local_1f8;
  undefined4 local_1ec;
  Vector<3> *local_1e8;
  undefined4 local_1dc;
  Vector<3> *local_1d8;
  undefined4 local_1cc;
  Vector<3> *local_1c8;
  undefined4 local_1bc;
  Tensor<3> *local_1b8;
  undefined4 local_1ac;
  Vector<3> *local_1a8;
  undefined4 local_19c;
  Vector<3> *local_198;
  undefined4 local_18c;
  Vector<3> *local_188;
  undefined4 local_17c;
  Vector<3> *local_178;
  undefined4 local_16c;
  Vector<3> *local_168;
  undefined4 local_15c;
  Vector<3> *local_158;
  undefined4 local_14c;
  Tensor<3> *local_148;
  undefined4 local_13c;
  Tensor<3> *local_138;
  undefined4 local_12c;
  Tensor<3> *local_128;
  undefined4 local_11c;
  Tensor<3> *local_118;
  undefined4 local_10c;
  Tensor<3> *local_108;
  undefined4 local_fc;
  Tensor<3> *local_f8;
  undefined4 local_ec;
  Tensor<3> *local_e8;
  undefined4 local_dc;
  Tensor<3> *local_d8;
  undefined4 local_cc;
  Tensor<3> *local_c8;
  undefined4 local_bc;
  Tensor<3> *local_b8;
  undefined4 local_ac;
  Tensor<3> *local_a8;
  undefined4 local_9c;
  Tensor<3> *local_98;
  undefined4 local_8c;
  Tensor<3> *local_88;
  undefined4 local_7c;
  double *local_78;
  undefined4 local_6c;
  double *local_68;
  undefined4 local_5c;
  double *local_58;
  undefined4 local_4c;
  double *local_48;
  undefined4 local_3c;
  double *local_38;
  undefined4 local_2c;
  double *local_28;
  Reals *local_20;
  Reals *local_18;
  ulong local_10;
  
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  weighted_contrib.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 3);
  size_in = weighted_contrib.shared_alloc_.direct_ptr._4_4_ * 6;
  local_20 = masses;
  local_18 = masses;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",&local_299);
  Write<double>::Write((Write<double> *)local_278,size_in,(string *)local_298);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  Read<double>::Read((Read<double> *)(v.super_Few<double,_6>.array_ + 5),coords);
  f.center.super_Few<double,_3>.array_[1] = center.super_Few<double,_3>.array_[2];
  f.coords.write_.shared_alloc_.direct_ptr = (void *)center.super_Few<double,_3>.array_[0];
  f.center.super_Few<double,_3>.array_[0] = center.super_Few<double,_3>.array_[1];
  Write<double>::Write
            ((Write<double> *)(f.center.super_Few<double,_3>.array_ + 2),(Write<double> *)local_278)
  ;
  Read<double>::Read((Read<double> *)&f.weighted_contrib.shared_alloc_.direct_ptr,masses);
  parallel_for<Omega_h::inertia::(anonymous_namespace)::get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)::__0>
            (weighted_contrib.shared_alloc_.direct_ptr._4_4_,
             (type *)(v.super_Few<double,_6>.array_ + 5),"get_matrix");
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_338,comm);
  Write<double>::Write(&local_358,(Write<double> *)local_278);
  Read<double>::Read(&local_348,&local_358);
  repro_sum(&local_338,&local_348,6,&local_328);
  Read<double>::~Read(&local_348);
  Write<double>::~Write(&local_358);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_338);
  memcpy(local_388,&local_328,0x30);
  memcpy(&local_230,local_388,0x30);
  local_28 = &local_230;
  local_2c = 0;
  local_8c = 0;
  local_14c = 0;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
  [0] = local_230;
  local_38 = &local_230;
  local_3c = 1;
  local_9c = 1;
  local_158 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 1;
  local_15c = 1;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[1].super_Few<double,_3>.array_
  [1] = local_228;
  local_48 = &local_230;
  local_4c = 2;
  local_ac = 2;
  local_168 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 2;
  local_16c = 2;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[2].super_Few<double,_3>.array_
  [2] = dStack_220;
  local_58 = &local_230;
  local_5c = 3;
  local_bc = 1;
  local_178 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 1;
  local_17c = 0;
  (local_178->super_Few<double,_3>).array_[0] = dStack_218;
  local_68 = &local_230;
  local_6c = 4;
  local_cc = 2;
  local_188 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 2;
  local_18c = 1;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[2].super_Few<double,_3>.array_
  [1] = dStack_210;
  local_78 = &local_230;
  local_7c = 5;
  local_dc = 2;
  local_198 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 2;
  local_19c = 0;
  (local_198->super_Few<double,_3>).array_[0] = dStack_208;
  local_ec = 1;
  local_1a8 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 1;
  local_1ac = 0;
  local_fc = 0;
  local_1bc = 1;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
  [1] = (local_1a8->super_Few<double,_3>).array_[0];
  local_10c = 2;
  local_1c8 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 2;
  local_1cc = 1;
  local_11c = 1;
  local_1d8 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 1;
  local_1dc = 2;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[1].super_Few<double,_3>.array_
  [2] = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[2].super_Few<double,_3>.
        array_[1];
  local_12c = 2;
  local_1e8 = (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_ + 2;
  local_1ec = 0;
  local_13c = 0;
  local_1fc = 2;
  (__return_storage_ptr__->super_Few<Omega_h::Vector<3>,_3>).array_[0].super_Few<double,_3>.array_
  [2] = (local_1e8->super_Few<double,_3>).array_[0];
  local_1f8 = __return_storage_ptr__;
  local_1b8 = __return_storage_ptr__;
  local_148 = __return_storage_ptr__;
  local_138 = __return_storage_ptr__;
  local_128 = __return_storage_ptr__;
  local_118 = __return_storage_ptr__;
  local_108 = __return_storage_ptr__;
  local_f8 = __return_storage_ptr__;
  local_e8 = __return_storage_ptr__;
  local_d8 = __return_storage_ptr__;
  local_c8 = __return_storage_ptr__;
  local_b8 = __return_storage_ptr__;
  local_a8 = __return_storage_ptr__;
  local_98 = __return_storage_ptr__;
  local_88 = __return_storage_ptr__;
  (anonymous_namespace)::
  get_matrix(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<double>,Omega_h::Vector<3>)
  ::$_0::~__0((__0 *)(v.super_Few<double,_6>.array_ + 5));
  Write<double>::~Write((Write<double> *)local_278);
  return __return_storage_ptr__;
}

Assistant:

Tensor<3> get_matrix(
    CommPtr comm, Reals coords, Reals masses, Vector<3> center) {
  auto n = masses.size();
  Write<Real> weighted_contrib(n * symm_ncomps(3));
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto x = get_vector<3>(coords, i);
    auto dxc = cross(x - center);
    set_symm(weighted_contrib, i, -masses[i] * (dxc * dxc));
  };
  parallel_for(n, f, "get_matrix");
  Vector<6> v;
  repro_sum(comm, Reals(weighted_contrib), 6, &v[0]);
  return vector2symm(v);
}